

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

double mxx::allreduce<double,std::plus<double>>(undefined8 x,long param_2)

{
  double result;
  custom_op<double,_true> op;
  
  custom_op<double,true>::custom_op<std::plus<double>>((custom_op<double,true> *)&op);
  MPI_Allreduce(x,&result,1,op.m_type_copy,op.m_op,*(undefined8 *)(param_2 + 8));
  custom_op<double,_true>::~custom_op(&op);
  return result;
}

Assistant:

inline T allreduce(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get custom op (and type for custom op)
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Allreduce(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    return result;
}